

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

ostream * Search::operator<<(ostream *os,action_cache *x)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*(uint *)(in_RSI + 4));
  poVar1 = std::operator<<(poVar1,':');
  std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xc));
  if ((*(byte *)(in_RSI + 8) & 1) != 0) {
    std::operator<<(in_RDI,'*');
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const action_cache& x)
{
  os << x.k << ':' << x.cost;
  if (x.is_opt)
    os << '*';
  return os;
}